

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

string * __thiscall
leveldb::log::RandomSkewedString_abi_cxx11_
          (string *__return_storage_ptr__,log *this,int i,Random *rnd)

{
  uint32_t uVar1;
  undefined4 in_register_00000014;
  string local_30;
  
  NumberString_abi_cxx11_(&local_30,this,i);
  uVar1 = Random::Skewed((Random *)CONCAT44(in_register_00000014,i),0x11);
  BigString(__return_storage_ptr__,&local_30,(ulong)uVar1);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string RandomSkewedString(int i, Random* rnd) {
  return BigString(NumberString(i), rnd->Skewed(17));
}